

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::Promise<void>_>::dispose(ArrayBuilder<kj::Promise<void>_> *this)

{
  Promise<void> *firstElement;
  RemoveConst<kj::Promise<void>_> *pRVar1;
  Promise<void> *pPVar2;
  Promise<void> *endCopy;
  Promise<void> *posCopy;
  Promise<void> *ptrCopy;
  ArrayBuilder<kj::Promise<void>_> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pPVar2 = this->endPtr;
  if (firstElement != (Promise<void> *)0x0) {
    this->ptr = (Promise<void> *)0x0;
    this->pos = (RemoveConst<kj::Promise<void>_> *)0x0;
    this->endPtr = (Promise<void> *)0x0;
    ArrayDisposer::dispose<kj::Promise<void>>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 4,
               (long)pPVar2 - (long)firstElement >> 4);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }